

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ziptool.c
# Opt level: O0

int get_num_entries(int argc,char **argv)

{
  char *pcVar1;
  zip_flags_t zVar2;
  long lVar3;
  zip_flags_t flags;
  zip_int64_t count;
  char **argv_local;
  int argc_local;
  
  zVar2 = get_flags(*argv);
  lVar3 = zip_get_num_entries(za,zVar2);
  pcVar1 = "get_num_entries";
  if (lVar3 == 1) {
    pcVar1 = "add directory";
  }
  printf("%ld entr%s in archive\n",lVar3,pcVar1 + 0xc);
  return 0;
}

Assistant:

static int
get_num_entries(int argc, char *argv[]) {
    zip_int64_t count;
    zip_flags_t flags;
    /* get number of entries in archive */
    flags = get_flags(argv[0]);
    count = zip_get_num_entries(za, flags);
    printf("%" PRId64 " entr%s in archive\n", count, count == 1 ? "y" : "ies");
    return 0;
}